

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O0

void merge_2way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  int iVar1;
  uchar *local_40;
  uchar *key1;
  uchar *key0;
  uchar **result_local;
  size_t n1_local;
  uchar **from1_local;
  size_t n0_local;
  uchar **from0_local;
  
  key1 = *from0;
  local_40 = *from1;
  if (n0 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                  ,0x46,
                  "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                 );
  }
  if (n1 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                  ,0x46,
                  "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                 );
  }
  if (from0 == (uchar **)0x0) {
    __assert_fail("from0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                  ,0x47,
                  "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                 );
  }
  if (from1 != (uchar **)0x0) {
    if (result == (uchar **)0x0) {
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x47,
                    "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    if (key1 != (uchar *)0x0) {
      key0 = (uchar *)result;
      result_local = (uchar **)n1;
      n1_local = (size_t)from1;
      from1_local = (uchar **)n0;
      n0_local = (size_t)from0;
      if (local_40 == (uchar *)0x0) {
        __assert_fail("key1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x48,
                      "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      do {
        iVar1 = cmp(key1,local_40);
        if (iVar1 < 1) {
          *(uchar **)key0 = key1;
          from1_local = (uchar **)((long)from1_local + -1);
          if (from1_local == (uchar **)0x0) {
            if (result_local != (uchar **)0x0) {
              memcpy(key0 + 8,(void *)n1_local,(long)result_local << 3);
              return;
            }
            __assert_fail("n1 > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x58,
                          "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          n0_local = n0_local + 8;
          key1 = *(uchar **)n0_local;
        }
        else {
          *(uchar **)key0 = local_40;
          result_local = (uchar **)((long)result_local + -1);
          if (result_local == (uchar **)0x0) {
            if (from1_local != (uchar **)0x0) {
              memcpy(key0 + 8,(void *)n0_local,(long)from1_local << 3);
              return;
            }
            __assert_fail("n0 > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x5e,
                          "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          n1_local = n1_local + 8;
          local_40 = *(uchar **)n1_local;
        }
        key0 = key0 + 8;
      } while( true );
    }
    __assert_fail("key0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                  ,0x48,
                  "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                 );
  }
  __assert_fail("from1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x47,
                "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
}

Assistant:

static void
merge_2way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
	assert(n0); assert(n1);
	assert(from0); assert(from1); assert(result);
	assert(key0); assert(key1);
	while (true) {
		if (cmp(key0, key1) <= 0) {
			*result++ = key0;
			if (--n0 == 0) goto finish0;
			++from0;
			key0 = *from0;
		} else {
			*result++ = key1;
			if (--n1 == 0) goto finish1;
			++from1;
			key1 = *from1;
		}
	}
finish0:
	assert(n0 == 0);
	assert(n1 > 0);
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	return;
finish1:
	assert(n1 == 0);
	assert(n0 > 0);
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	(void) memcpy(result, from0, n0*sizeof(unsigned char*));
	return;
}